

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  FieldGenerator *pFVar4;
  Descriptor *pDVar5;
  int iVar6;
  int i;
  int extraout_EDX;
  long extraout_RDX;
  long extraout_RDX_00;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_01;
  long lVar7;
  cxx *field_00;
  long lVar8;
  ulong uVar9;
  string local_58;
  FieldGeneratorMap *local_38;
  
  io::Printer::Print(printer,"void $classname$::Clear() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  pDVar5 = this->descriptor_;
  lVar7 = extraout_RDX;
  if (0 < *(int *)(pDVar5 + 0x58)) {
    io::Printer::Print(printer,"_extensions_.Clear();\n");
    pDVar5 = this->descriptor_;
    lVar7 = extraout_RDX_00;
  }
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    local_38 = &this->field_generators_;
    iVar6 = -1;
    lVar8 = 0;
    uVar9 = 0;
    do {
      i = (int)lVar7;
      lVar7 = *(long *)(pDVar5 + 0x30);
      if (*(int *)(lVar7 + 0x30 + lVar8) != 3) {
        iVar2 = iVar6 + 7;
        if (iVar6 >= 0) {
          iVar2 = iVar6;
        }
        if (iVar6 < 0) {
LAB_001bfce0:
          if (-1 < iVar6) {
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n");
            i = extraout_EDX;
          }
          if (*(char *)(lVar7 + 0x34 + lVar8) == '\0') {
            plVar3 = (long *)(*(long *)(lVar7 + 0x38 + lVar8) + 0x30);
          }
          else {
            lVar1 = *(long *)(lVar7 + 0x40 + lVar8);
            if (lVar1 == 0) {
              plVar3 = (long *)(*(long *)(lVar7 + 0x20 + lVar8) + 0x80);
            }
            else {
              plVar3 = (long *)(lVar1 + 0x70);
            }
          }
          SimpleItoa_abi_cxx11_
                    (&local_58,
                     (protobuf *)
                     (ulong)(uint)((int)((ulong)((lVar7 - *plVar3) + lVar8) >> 3) * -0x11111111),i);
          io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n"
                             ,"index",&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          field = extraout_RDX_01;
        }
        else {
          field = (FieldDescriptor *)(uVar9 >> 3 & 0x1fffffff);
          i = (int)field;
          if (i != iVar2 >> 3) goto LAB_001bfce0;
        }
        field_00 = (cxx *)(lVar7 + lVar8);
        iVar6 = (int)uVar9;
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar7 + 0x2c + lVar8) * 4
                    ) - 9U < 2) {
          FieldName_abi_cxx11_(&local_58,field_00,field);
          io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pFVar4 = FieldGeneratorMap::get(local_38,(FieldDescriptor *)field_00);
          (*pFVar4->_vptr_FieldGenerator[6])(pFVar4,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
        }
        else {
          pFVar4 = FieldGeneratorMap::get(local_38,(FieldDescriptor *)field_00);
          (*pFVar4->_vptr_FieldGenerator[6])(pFVar4,printer);
        }
      }
      uVar9 = uVar9 + 1;
      pDVar5 = this->descriptor_;
      lVar7 = (long)*(int *)(pDVar5 + 0x2c);
      lVar8 = lVar8 + 0x78;
    } while ((long)uVar9 < lVar7);
    if (-1 < iVar6) {
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      pDVar5 = this->descriptor_;
    }
  }
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      if (*(int *)(*(long *)(pDVar5 + 0x30) + 0x30 + lVar7) == 3) {
        pFVar4 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar7));
        (*pFVar4->_vptr_FieldGenerator[6])(pFVar4,printer);
        pDVar5 = this->descriptor_;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x78;
    } while (lVar8 < *(int *)(pDVar5 + 0x2c));
  }
  io::Printer::Print(printer,"::memset(_has_bits_, 0, sizeof(_has_bits_));\n");
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"mutable_unknown_fields()->Clear();\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateClear(io::Printer* printer) {
  printer->Print("void $classname$::Clear() {\n",
                 "classname", classname_);
  printer->Indent();

  int last_index = -1;

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.Clear();\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // We can use the fact that _has_bits_ is a giant bitfield to our
      // advantage:  We can check up to 32 bits at a time for equality to
      // zero, and skip the whole range if so.  This can improve the speed
      // of Clear() for messages which contain a very large number of
      // optional fields of which only a few are used at a time.  Here,
      // we've chosen to check 8 bits at a time rather than 32.
      if (i / 8 != last_index / 8 || last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }
      last_index = i;

      // It's faster to just overwrite primitive types, but we should
      // only clear strings and messages if they were set.
      // TODO(kenton):  Let the CxxFieldGenerator decide this somehow.
      bool should_check_bit =
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_STRING;

      if (should_check_bit) {
        printer->Print(
          "if (has_$name$()) {\n",
          "name", FieldName(field));
        printer->Indent();
      }

      field_generators_.get(field).GenerateClearingCode(printer);

      if (should_check_bit) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  // Repeated fields don't use _has_bits_ so we clear them in a separate
  // pass.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      field_generators_.get(field).GenerateClearingCode(printer);
    }
  }

  printer->Print(
    "::memset(_has_bits_, 0, sizeof(_has_bits_));\n");

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "mutable_unknown_fields()->Clear();\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}